

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<float,int,long_double>
                 (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble lVar13;
  longdouble lVar14;
  longdouble local_e8;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  iVar1 = Xc_indptr[col_num];
  lVar5 = (long)iVar1;
  iVar2 = Xc_indptr[col_num + 1];
  lVar6 = (long)iVar2;
  if (iVar2 != iVar1) {
    lVar4 = nrows - (long)(iVar2 - iVar1);
    lVar7 = (longdouble)lVar4 + (longdouble)(float)(&DAT_0036e0d8)[lVar4 < 0];
    lVar4 = lVar5;
    if (iVar1 < iVar2) {
      do {
        lVar7 = lVar7 + (longdouble)w[Xc_ind[lVar4]];
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
    lVar10 = (longdouble)0;
    if (lVar10 < lVar7) {
      if (missing_action == Fail) {
        lVar8 = in_ST1;
        lVar12 = in_ST1;
        lVar13 = in_ST1;
        if (iVar2 <= iVar1) {
          return -INFINITY;
        }
        do {
          lVar11 = lVar13;
          lVar10 = lVar12;
          lVar9 = lVar8;
          local_e8 = in_ST0;
          lVar8 = in_ST1;
          lVar12 = in_ST1;
          lVar13 = in_ST1;
          fmal();
          fmal();
          lVar14 = lVar13;
          fmal();
          fmal();
          lVar5 = lVar5 + 1;
          in_ST0 = in_ST1;
          in_ST1 = lVar14;
        } while (lVar6 != lVar5);
      }
      else {
        lVar9 = lVar10;
        lVar11 = lVar10;
        local_e8 = lVar10;
        if (iVar1 < iVar2) {
          lVar10 = (longdouble)0;
          lVar9 = lVar10;
          lVar11 = lVar10;
          local_e8 = lVar10;
          do {
            lVar8 = (longdouble)Xc[lVar5];
            local_68 = SUB108(lVar8,0);
            uStack_60 = (ushort)((unkuint10)lVar8 >> 0x40);
            lVar8 = in_ST0;
            if ((NAN(Xc[lVar5])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000))
            {
              lVar7 = lVar7 - (longdouble)w[Xc_ind[lVar5]];
            }
            else {
              lVar9 = in_ST0;
              lVar10 = in_ST0;
              lVar11 = in_ST0;
              fmal();
              fmal();
              fmal();
              fmal();
              local_e8 = in_ST0;
            }
            lVar5 = lVar5 + 1;
            in_ST0 = lVar8;
          } while (lVar6 != lVar5);
        }
        if (lVar7 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      if ((longdouble)1 < lVar7) {
        if ((lVar9 != (longdouble)0) || (NAN(lVar9) || NAN((longdouble)0))) {
          if ((lVar9 != local_e8 * local_e8) || (NAN(lVar9) || NAN(local_e8 * local_e8))) {
            lVar8 = local_e8 / lVar7;
            lVar12 = lVar8 * lVar8;
            lVar13 = lVar9 / lVar7 - lVar12;
            if ((!NAN(lVar13)) &&
               (((longdouble)2.220446e-16 < lVar13 ||
                ((bVar3 = check_more_than_two_unique_values<float,int>
                                    (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action),
                 (longdouble)0 < lVar13 && (bVar3)))))) {
              lVar7 = (lVar8 * lVar12 * lVar8 * lVar7 +
                      local_e8 * (longdouble)-4.0 * lVar12 * lVar8 +
                      lVar9 * (longdouble)6.0 * lVar12 + lVar10 * (longdouble)-4.0 * lVar8 + lVar11)
                      / (lVar13 * lVar13 * lVar7);
              uStack_70 = (ushort)((unkuint10)lVar7 >> 0x40);
              local_78 = SUB108(lVar7,0);
              if (((unkuint10)lVar7 & 0x7fff) == 0 ||
                  (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
                if ((double)lVar7 <= 0.0) {
                  return 0.0;
                }
                return (double)lVar7;
              }
            }
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}